

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.c
# Opt level: O3

sysbvm_tuple_t
sysbvm_type_createAnonymousPrimitiveValueTypeAndValueMetatype
          (sysbvm_context_t *context,sysbvm_tuple_t supertype)

{
  ulong *puVar1;
  ulong uVar2;
  sysbvm_tuple_t sVar3;
  sysbvm_tuple_t sVar4;
  ulong uVar5;
  ulong uVar6;
  
  sVar3 = (context->roots).primitiveValueType;
  uVar6 = supertype & 0xf;
  if (uVar6 == 0 && supertype != 0) {
    uVar6 = *(ulong *)supertype;
  }
  else if ((int)uVar6 == 0xf) {
    uVar6 = sysbvm_tuple_getImmediateTrivialTypeWithIndex(context,supertype >> 4);
  }
  else {
    uVar6 = sysbvm_tuple_getImmediateTypeWithTag(context,uVar6);
  }
  uVar2 = (context->roots).primitiveValueType;
  sVar4 = sVar3;
  if ((((uVar2 & 0xf) == 0 && uVar2 != 0) && ((uVar6 & 0xf) == 0 && uVar6 != 0)) &&
     (uVar5 = uVar6, (*(byte *)(uVar6 + 8) & 0x80) == 0)) {
    do {
      sVar4 = uVar6;
      if (uVar5 == uVar2) break;
      puVar1 = (ulong *)(uVar5 + 0x30);
      uVar5 = *puVar1;
      sVar4 = sVar3;
    } while (*puVar1 != 0);
  }
  sVar3 = sysbvm_type_createAnonymousValueMetatype(context,sVar4,0x1d);
  sVar4 = sysbvm_type_createAnonymousPrimitiveValueType(context,supertype,sVar3);
  if ((sVar3 & 0xf) == 0 && sVar3 != 0) {
    *(undefined8 *)(sVar3 + 0x70) = 0x11b;
  }
  *(sysbvm_tuple_t *)(sVar3 + 0xf8) = sVar4;
  return sVar4;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_type_createAnonymousPrimitiveValueTypeAndValueMetatype(sysbvm_context_t *context, sysbvm_tuple_t supertype)
{
    sysbvm_tuple_t metatypeSupertype = context->roots.primitiveValueType;
    sysbvm_tuple_t actualSuperType = supertype;
    sysbvm_tuple_t supertypeMetatype = sysbvm_tuple_getType(context, supertype);
    if(sysbvm_type_isDirectSubtypeOf(supertypeMetatype, context->roots.primitiveValueType))
        metatypeSupertype = supertypeMetatype;

    sysbvm_tuple_t metatype = sysbvm_type_createAnonymousValueMetatype(context, metatypeSupertype, SYSBVM_SLOT_COUNT_FOR_STRUCTURE_TYPE(sysbvm_primitiveValueType_t));
    sysbvm_tuple_t primitiveValueType = sysbvm_type_createAnonymousPrimitiveValueType(context, actualSuperType, metatype);

    sysbvm_type_setFlags(context, metatype, SYSBVM_TYPE_FLAGS_PRIMITIVE_VALUE_TYPE_METATYPE_FLAGS);

    // Link together the type with its metatype.
    sysbvm_metatype_t *metatypeObject = (sysbvm_metatype_t*)metatype;
    metatypeObject->thisType = primitiveValueType;
    return primitiveValueType;
}